

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O1

bool FIX::double_conversion::FastFixedDtoa
               (double v,int fractional_count,Vector<char> buffer,int *length,int *decimal_point)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  uint64_t d64;
  uint uVar3;
  uint32_t number;
  ulong uVar4;
  ulong uVar5;
  double_conversion *this;
  byte bVar6;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  double_conversion *pdVar10;
  int iVar11;
  int *in_R9;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  Vector<char> buffer_06;
  Vector<char> buffer_07;
  undefined3 in_stack_ffffffffffffffc0;
  undefined4 uVar15;
  
  pcVar7 = buffer.start_;
  uVar3 = buffer.length_;
  bVar14 = ((ulong)v & 0x7ff0000000000000) == 0;
  this = (double_conversion *)((ulong)v & 0xfffffffffffff) + 0x10000000000000;
  if (bVar14) {
    this = (double_conversion *)((ulong)v & 0xfffffffffffff);
  }
  uVar9 = 0xfffffbce;
  if (!bVar14) {
    uVar9 = ((uint)((ulong)v >> 0x34) & 0x7ff) - 0x433;
  }
  bVar14 = fractional_count < 0x15 && (int)uVar9 < 0x15;
  if (fractional_count >= 0x15 || (int)uVar9 >= 0x15) {
    return bVar14;
  }
  *length = 0;
  uVar15 = CONCAT13(bVar14,in_stack_ffffffffffffffc0);
  bVar6 = (byte)uVar9;
  number = (uint32_t)buffer.start_;
  if ((int)uVar9 < 0xc) {
    auVar2 = buffer._0_12_;
    if (-1 < (int)uVar9) {
      buffer_00._12_4_ = 0;
      buffer_00.start_ = (char *)auVar2._0_8_;
      buffer_00.length_ = auVar2._8_4_;
      FillDigits64((long)this << (bVar6 & 0x3f),buffer_00,length);
      iVar12 = *length;
      goto LAB_0016edca;
    }
    if ((int)uVar9 < -0x34) {
      if (-0x81 < (int)uVar9) {
        *decimal_point = 0;
        goto LAB_0016ef57;
      }
      if ((int)uVar3 < 1) goto LAB_0016ef6a;
      *pcVar7 = '\0';
      *length = 0;
      *decimal_point = -fractional_count;
    }
    else {
      pdVar10 = (double_conversion *)((ulong)this >> (-bVar6 & 0x3f));
      this = this + -((long)pdVar10 << (-bVar6 & 0x3f));
      if ((ulong)pdVar10 >> 0x20 == 0) {
        buffer_03.start_ = (char *)(ulong)uVar3;
        buffer_03._8_8_ = length;
        FillDigits32(pdVar10,number,buffer_03,(int *)(ulong)(uint)fractional_count);
      }
      else {
        buffer_01._12_4_ = 0;
        buffer_01.start_ = (char *)auVar2._0_8_;
        buffer_01.length_ = auVar2._8_4_;
        FillDigits64((uint64_t)pdVar10,buffer_01,length);
      }
      *decimal_point = *length;
LAB_0016ef57:
      buffer_07.start_ = (char *)(ulong)uVar3;
      buffer_07._8_8_ = length;
      FillFractionals(this,(ulong)uVar9,fractional_count,number,buffer_07,decimal_point,
                      (int *)CONCAT44(fractional_count,uVar15));
    }
  }
  else {
    if ((int)uVar9 < 0x12) {
      uVar5 = 0xb1a2bc2ec5 << (0x11 - bVar6 & 0x3f);
      pdVar10 = (double_conversion *)((ulong)this / uVar5);
      uVar5 = (ulong)this % uVar5 << (bVar6 & 0x3f);
    }
    else {
      uVar5 = (long)this << (bVar6 - 0x11 & 0x3f);
      pdVar10 = (double_conversion *)(uVar5 / 0xb1a2bc2ec5);
      uVar5 = (uVar5 % 0xb1a2bc2ec5) * 0x20000;
    }
    buffer_02.start_ = (char *)(ulong)uVar3;
    buffer_02._8_8_ = length;
    FillDigits32(pdVar10,number,buffer_02,(int *)(ulong)(uint)fractional_count);
    iVar12 = (int)(uVar5 / 10000000);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar5 / 10000000;
    buffer_04.start_ = (char *)(ulong)uVar3;
    buffer_04._8_8_ = length;
    FillDigits32FixedLength((double_conversion *)(uVar5 / 100000000000000),3,number,buffer_04,in_R9)
    ;
    buffer_05.start_ = (char *)(ulong)uVar3;
    buffer_05._8_8_ = length;
    FillDigits32FixedLength
              ((double_conversion *)
               (ulong)(uint)(iVar12 + SUB164(auVar1 * ZEXT816(0x1ad7f29abcb),8) * -10000000),7,
               number,buffer_05,in_R9);
    buffer_06.start_ = (char *)(ulong)uVar3;
    buffer_06._8_8_ = length;
    FillDigits32FixedLength
              ((double_conversion *)(ulong)(uint)((int)uVar5 + iVar12 * -10000000),7,number,
               buffer_06,in_R9);
    iVar12 = *length;
LAB_0016edca:
    *decimal_point = iVar12;
  }
  uVar5 = (ulong)*length;
  if (0 < (long)uVar5) {
    if ((int)uVar3 < *length) goto LAB_0016ef6a;
    do {
      if (pcVar7[uVar5 - 1] != '0') goto LAB_0016ee13;
      *length = (int)uVar5 + -1;
      bVar14 = 1 < (long)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar14);
    uVar5 = 0;
  }
LAB_0016ee13:
  if ((int)uVar5 < 1) {
    uVar13 = 0;
  }
  else {
    uVar13 = 0;
    uVar4 = 0;
    if (0 < (int)uVar3) {
      uVar4 = (ulong)uVar3;
    }
    do {
      if (uVar4 == uVar13) goto LAB_0016ef6a;
      if (pcVar7[uVar13] != '0') goto LAB_0016ee48;
      uVar13 = uVar13 + 1;
    } while ((uVar5 & 0xffffffff) != uVar13);
    uVar13 = uVar5 & 0xffffffff;
  }
LAB_0016ee48:
  iVar12 = (int)uVar13;
  if (iVar12 != 0) {
    iVar11 = *length;
    if (iVar12 < iVar11) {
      lVar8 = 0;
      uVar5 = uVar13 & 0xffffffff;
      do {
        if (((int)uVar3 <= (int)uVar5) || ((int)uVar3 <= lVar8)) goto LAB_0016ef6a;
        pcVar7[lVar8] = pcVar7[lVar8 + (uVar13 & 0xffffffff)];
        iVar11 = *length;
        uVar9 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar9;
        lVar8 = lVar8 + 1;
      } while ((int)uVar9 < iVar11);
    }
    *length = iVar11 - iVar12;
    *decimal_point = *decimal_point - iVar12;
  }
  iVar12 = *length;
  if ((-1 < (long)iVar12) && (iVar12 < (int)uVar3)) {
    pcVar7[iVar12] = '\0';
    if (*length == 0) {
      *decimal_point = -fractional_count;
    }
    return (bool)(char)((uint)uVar15 >> 0x18);
  }
LAB_0016ef6a:
  __assert_fail("0 <= index && index < length_",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                ,0xcc,"T &FIX::double_conversion::Vector<char>::operator[](int) const [T = char]");
}

Assistant:

bool FastFixedDtoa(double v,
                   int fractional_count,
                   Vector<char> buffer,
                   int* length,
                   int* decimal_point) {
  const uint32_t kMaxUInt32 = 0xFFFFFFFF;
  uint64_t significand = Double(v).Significand();
  int exponent = Double(v).Exponent();
  // v = significand * 2^exponent (with significand a 53bit integer).
  // If the exponent is larger than 20 (i.e. we may have a 73bit number) then we
  // don't know how to compute the representation. 2^73 ~= 9.5*10^21.
  // If necessary this limit could probably be increased, but we don't need
  // more.
  if (exponent > 20) return false;
  if (fractional_count > 20) return false;
  *length = 0;
  // At most kDoubleSignificandSize bits of the significand are non-zero.
  // Given a 64 bit integer we have 11 0s followed by 53 potentially non-zero
  // bits:  0..11*..0xxx..53*..xx
  if (exponent + kDoubleSignificandSize > 64) {
    // The exponent must be > 11.
    //
    // We know that v = significand * 2^exponent.
    // And the exponent > 11.
    // We simplify the task by dividing v by 10^17.
    // The quotient delivers the first digits, and the remainder fits into a 64
    // bit number.
    // Dividing by 10^17 is equivalent to dividing by 5^17*2^17.
    const uint64_t kFive17 = UINT64_2PART_C(0xB1, A2BC2EC5);  // 5^17
    uint64_t divisor = kFive17;
    int divisor_power = 17;
    uint64_t dividend = significand;
    uint32_t quotient;
    uint64_t remainder;
    // Let v = f * 2^e with f == significand and e == exponent.
    // Then need q (quotient) and r (remainder) as follows:
    //   v            = q * 10^17       + r
    //   f * 2^e      = q * 10^17       + r
    //   f * 2^e      = q * 5^17 * 2^17 + r
    // If e > 17 then
    //   f * 2^(e-17) = q * 5^17        + r/2^17
    // else
    //   f  = q * 5^17 * 2^(17-e) + r/2^e
    if (exponent > divisor_power) {
      // We only allow exponents of up to 20 and therefore (17 - e) <= 3
      dividend <<= exponent - divisor_power;
      quotient = static_cast<uint32_t>(dividend / divisor);
      remainder = (dividend % divisor) << divisor_power;
    } else {
      divisor <<= divisor_power - exponent;
      quotient = static_cast<uint32_t>(dividend / divisor);
      remainder = (dividend % divisor) << exponent;
    }
    FillDigits32(quotient, buffer, length);
    FillDigits64FixedLength(remainder, buffer, length);
    *decimal_point = *length;
  } else if (exponent >= 0) {
    // 0 <= exponent <= 11
    significand <<= exponent;
    FillDigits64(significand, buffer, length);
    *decimal_point = *length;
  } else if (exponent > -kDoubleSignificandSize) {
    // We have to cut the number.
    uint64_t integrals = significand >> -exponent;
    uint64_t fractionals = significand - (integrals << -exponent);
    if (integrals > kMaxUInt32) {
      FillDigits64(integrals, buffer, length);
    } else {
      FillDigits32(static_cast<uint32_t>(integrals), buffer, length);
    }
    *decimal_point = *length;
    FillFractionals(fractionals, exponent, fractional_count,
                    buffer, length, decimal_point);
  } else if (exponent < -128) {
    // This configuration (with at most 20 digits) means that all digits must be
    // 0.
    ASSERT(fractional_count <= 20);
    buffer[0] = '\0';
    *length = 0;
    *decimal_point = -fractional_count;
  } else {
    *decimal_point = 0;
    FillFractionals(significand, exponent, fractional_count,
                    buffer, length, decimal_point);
  }
  TrimZeros(buffer, length, decimal_point);
  buffer[*length] = '\0';
  if ((*length) == 0) {
    // The string is empty and the decimal_point thus has no importance. Mimick
    // Gay's dtoa and and set it to -fractional_count.
    *decimal_point = -fractional_count;
  }
  return true;
}